

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::timerEvent(QAbstractItemView *this,QTimerEvent *event)

{
  TimerId TVar1;
  QAbstractItemViewPrivate *this_00;
  char cVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  TVar1 = *(TimerId *)(event + 0x10);
  if (TVar1 == (this_00->fetchMoreTimer).m_id) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QAbstractItemViewPrivate::fetchMore(this_00);
      return;
    }
    goto LAB_0054058a;
  }
  if (TVar1 == (this_00->delayedReset).m_id) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (**(code **)(*(long *)this + 0x210))(this);
      return;
    }
    goto LAB_0054058a;
  }
  if (TVar1 == (this_00->autoScrollTimer).m_id) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      doAutoScroll(this);
      return;
    }
    goto LAB_0054058a;
  }
  if (TVar1 == (this_00->updateTimer).m_id) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QAbstractItemViewPrivate::updateDirtyRegion(this_00);
      return;
    }
    goto LAB_0054058a;
  }
  if (TVar1 == (this_00->delayedEditing).m_id) {
    QBasicTimer::stop();
    currentIndex((QModelIndex *)&local_38,this);
    edit(this,(QModelIndex *)&local_38);
  }
  else if (TVar1 == (this_00->delayedLayout).m_id) {
    QBasicTimer::stop();
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
      QBasicTimer::stop();
      this_00->delayedPendingLayout = false;
      (**(code **)(*(long *)this + 0x220))(this);
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      currentIndex((QModelIndex *)&local_38,this);
      if ((((-1 < (int)local_38) && (-1 < (long)local_38)) &&
          (local_28.ptr != (QAbstractItemModel *)0x0)) && (this_00->state == EditingState)) {
        lVar3 = *(long *)this;
LAB_00540548:
        (**(code **)(lVar3 + 0x1e8))(this,&local_38,0);
      }
    }
  }
  else if (TVar1 == (this_00->delayedAutoScroll).m_id) {
    QBasicTimer::stop();
    cVar2 = QPersistentModelIndex::isValid();
    if (cVar2 != '\0') {
      currentIndex((QModelIndex *)&local_38,this);
      cVar2 = comparesEqual(&this_00->pressedIndex,(QModelIndex *)&local_38);
      if (cVar2 != '\0') {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_38,&this_00->pressedIndex);
        lVar3 = *(long *)this;
        goto LAB_00540548;
      }
    }
  }
  else if (TVar1 == (this_00->pressClosedEditorWatcher).m_id) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QBasicTimer::stop();
      return;
    }
    goto LAB_0054058a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0054058a:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::timerEvent(QTimerEvent *event)
{
    Q_D(QAbstractItemView);
    if (event->timerId() == d->fetchMoreTimer.timerId())
        d->fetchMore();
    else if (event->timerId() == d->delayedReset.timerId())
        reset();
    else if (event->timerId() == d->autoScrollTimer.timerId())
        doAutoScroll();
    else if (event->timerId() == d->updateTimer.timerId())
        d->updateDirtyRegion();
    else if (event->timerId() == d->delayedEditing.timerId()) {
        d->delayedEditing.stop();
        edit(currentIndex());
    } else if (event->timerId() == d->delayedLayout.timerId()) {
        d->delayedLayout.stop();
        if (isVisible()) {
            d->interruptDelayedItemsLayout();
            doItemsLayout();
            const QModelIndex current = currentIndex();
            if (current.isValid() && d->state == QAbstractItemView::EditingState)
                scrollTo(current);
        }
    } else if (event->timerId() == d->delayedAutoScroll.timerId()) {
        d->delayedAutoScroll.stop();
        //end of the timer: if the current item is still the same as the one when the mouse press occurred
        //we only get here if there was no double click
        if (d->pressedIndex.isValid() && d->pressedIndex == currentIndex())
            scrollTo(d->pressedIndex);
    } else if (event->timerId() == d->pressClosedEditorWatcher.timerId()) {
        d->pressClosedEditorWatcher.stop();
    }
}